

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O2

void __thiscall
GeneratorExpressionContent::~GeneratorExpressionContent(GeneratorExpressionContent *this)

{
  ~GeneratorExpressionContent(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

GeneratorExpressionContent::~GeneratorExpressionContent()
{
  cmDeleteAll(this->IdentifierChildren);
  std::for_each(this->ParamChildren.begin(), this->ParamChildren.end(),
                cmDeleteAll<std::vector<cmGeneratorExpressionEvaluator*> >);
}